

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

nifti_image * nifti_copy_nim_info(nifti_image *src)

{
  nifti_image *nim_dest;
  char *pcVar1;
  
  nim_dest = (nifti_image *)calloc(1,0x2b8);
  if (nim_dest == (nifti_image *)0x0) {
    nifti_copy_nim_info_cold_1();
    nim_dest = (nifti_image *)0x0;
  }
  else {
    memcpy(nim_dest,src,0x2b8);
    if (src->fname != (char *)0x0) {
      pcVar1 = nifti_strdup(src->fname);
      nim_dest->fname = pcVar1;
    }
    if (src->iname != (char *)0x0) {
      pcVar1 = nifti_strdup(src->iname);
      nim_dest->iname = pcVar1;
    }
    nim_dest->num_ext = 0;
    nim_dest->ext_list = (nifti1_extension *)0x0;
    nifti_copy_extensions(nim_dest,src);
    nim_dest->data = (void *)0x0;
  }
  return nim_dest;
}

Assistant:

nifti_image * nifti_copy_nim_info(const nifti_image * src)
{
  nifti_image *dest;
  dest = (nifti_image *)calloc(1,sizeof(nifti_image));
  if( !dest ){
     fprintf(stderr,"** NCNI: failed to alloc nifti_image\n");
     return NULL;
  }
  memcpy(dest, src, sizeof(nifti_image));
  if( src->fname ) dest->fname = nifti_strdup(src->fname);
  if( src->iname ) dest->iname = nifti_strdup(src->iname);
  dest->num_ext = 0;
  dest->ext_list = NULL;
  /* errors will be printed in NCE(), continue in either case */
  (void)nifti_copy_extensions(dest, src);

  dest->data = NULL;

  return dest;
}